

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
HBF::heuristic_basic
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,HBF *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *grid,vector<double,_std::allocator<double>_> *start,
          vector<int,_std::allocator<int>_> *goal)

{
  allocator<int> *this_00;
  allocator<std::vector<int,_std::allocator<int>_>_> *this_01;
  int iVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_04;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  ulong uVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  int *piVar10;
  vector<int,_std::allocator<int>_> *local_288;
  int local_224;
  int local_220;
  int j_1;
  int i_2;
  int local_214;
  int temp;
  int y2;
  int x2;
  int i_1;
  int g;
  int local_1fc;
  iterator local_1f8;
  size_type local_1f0;
  vector<int,_std::allocator<int>_> local_1e8;
  allocator<int> local_1c9;
  int local_1c8;
  int local_1c4;
  iterator local_1c0;
  size_type local_1b8;
  vector<int,_std::allocator<int>_> local_1b0;
  allocator<int> local_191;
  int local_190;
  int local_18c;
  iterator local_188;
  size_type local_180;
  vector<int,_std::allocator<int>_> local_178;
  allocator<int> local_159;
  int local_158;
  int local_154;
  iterator local_150;
  size_type local_148;
  vector<int,_std::allocator<int>_> local_140;
  undefined1 local_128 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  next_state;
  int y;
  int x;
  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  local_f8;
  const_iterator local_f0;
  undefined1 local_e8 [8];
  vector<int,_std::allocator<int>_> next;
  int local_c8;
  int local_c4;
  iterator local_c0;
  size_type local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  vector<int,_std::allocator<int>_> local_a8;
  undefined1 local_90 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  opened;
  int local_60;
  int j;
  int i;
  undefined1 local_50 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  closed;
  vector<int,_std::allocator<int>_> *goal_local;
  vector<double,_std::allocator<double>_> *start_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *grid_local;
  HBF *this_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *heuristic;
  
  closed.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,grid);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_50,grid);
  for (local_60 = 0;
      sVar5 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(__return_storage_ptr__), (ulong)(long)local_60 < sVar5; local_60 = local_60 + 1
      ) {
    opened.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    while( true ) {
      uVar6 = (ulong)opened.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](__return_storage_ptr__,0);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
      if (sVar5 <= uVar6) break;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](__return_storage_ptr__,(long)local_60);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvVar7,(long)opened.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (*pvVar8 == 1) {
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](__return_storage_ptr__,(long)local_60);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (pvVar7,(long)opened.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        *pvVar8 = 999;
      }
      opened.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           opened.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
  }
  next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_b0 = &local_a8;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](start,0);
  local_c8 = (int)*pvVar9;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](start,1);
  local_c4 = (int)*pvVar9;
  local_c0 = &local_c8;
  local_b8 = 2;
  this_00 = (allocator<int> *)
            ((long)&next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(this_00);
  __l_03._M_len = local_b8;
  __l_03._M_array = local_c0;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l_03,this_00);
  next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_90._0_8_ = &local_a8;
  local_90._8_8_ = (pointer)0x1;
  this_01 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
            ((long)&next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this_01);
  __l_04._M_len = local_90._8_8_;
  __l_04._M_array = (iterator)local_90._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_90 + 0x10),__l_04,this_01);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_288 = (vector<int,_std::allocator<int>_> *)local_90;
  do {
    local_288 = local_288 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_288);
  } while (local_288 != &local_a8);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&next.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](start,0);
  pvVar7 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](__return_storage_ptr__,(long)(int)*pvVar9);
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](start,1);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)(int)*pvVar9);
  *pvVar8 = 1;
  do {
    bVar2 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::empty((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)(local_90 + 0x10));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(local_90 + 0x10),0);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_e8,pvVar7);
    local_f8._M_current =
         (vector<int,_std::allocator<int>_> *)
         std::
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(local_90 + 0x10));
    __gnu_cxx::
    __normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
    ::__normal_iterator<std::vector<int,std::allocator<int>>*>
              ((__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                *)&local_f0,&local_f8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::erase((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_90 + 0x10),local_f0);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_e8,0);
    iVar3 = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_e8,1);
    iVar1 = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](goal,0);
    if ((iVar3 == *pvVar8) &&
       (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](goal,1), iVar1 == *pvVar8)) {
      next_state.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 9;
    }
    else {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)local_128);
      local_158 = iVar3 + -1;
      local_150 = &local_158;
      local_148 = 2;
      local_154 = iVar1;
      std::allocator<int>::allocator(&local_159);
      __l_02._M_len = local_148;
      __l_02._M_array = local_150;
      std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_02,&local_159);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_128,&local_140);
      std::vector<int,_std::allocator<int>_>::~vector(&local_140);
      std::allocator<int>::~allocator(&local_159);
      local_18c = iVar1 + 1;
      local_188 = &local_190;
      local_180 = 2;
      local_190 = iVar3;
      std::allocator<int>::allocator(&local_191);
      __l_01._M_len = local_180;
      __l_01._M_array = local_188;
      std::vector<int,_std::allocator<int>_>::vector(&local_178,__l_01,&local_191);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_128,&local_178);
      std::vector<int,_std::allocator<int>_>::~vector(&local_178);
      std::allocator<int>::~allocator(&local_191);
      local_1c8 = iVar3 + 1;
      local_1c0 = &local_1c8;
      local_1b8 = 2;
      local_1c4 = iVar1;
      std::allocator<int>::allocator(&local_1c9);
      __l_00._M_len = local_1b8;
      __l_00._M_array = local_1c0;
      std::vector<int,_std::allocator<int>_>::vector(&local_1b0,__l_00,&local_1c9);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_128,&local_1b0);
      std::vector<int,_std::allocator<int>_>::~vector(&local_1b0);
      std::allocator<int>::~allocator(&local_1c9);
      local_1fc = iVar1 + -1;
      local_1f8 = &g;
      local_1f0 = 2;
      g = iVar3;
      std::allocator<int>::allocator((allocator<int> *)((long)&i_1 + 3));
      __l._M_len = local_1f0;
      __l._M_array = local_1f8;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1e8,__l,(allocator<int> *)((long)&i_1 + 3));
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_128,&local_1e8);
      std::vector<int,_std::allocator<int>_>::~vector(&local_1e8);
      std::allocator<int>::~allocator((allocator<int> *)((long)&i_1 + 3));
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](__return_storage_ptr__,(long)iVar3);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)iVar1);
      x2 = *pvVar8;
      for (y2 = 0; uVar6 = (ulong)y2,
          sVar5 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)local_128), uVar6 < sVar5; y2 = y2 + 1) {
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_128,(long)y2);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,0);
        temp = *pvVar8;
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_128,(long)y2);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,1);
        local_214 = *pvVar8;
        i_2 = 0;
        if (((-1 < temp) &&
            (uVar6 = (ulong)temp,
            sVar5 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::size(grid), uVar6 < sVar5)) && (-1 < local_214)) {
          uVar6 = (ulong)local_214;
          pvVar7 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](grid,0);
          sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
          if (uVar6 < sVar5) {
            iVar3 = idx(this,(double)temp);
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](__return_storage_ptr__,(long)iVar3);
            iVar3 = idx(this,(double)local_214);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)iVar3);
            iVar3 = *pvVar8;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_50,(long)temp);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_214);
            if (iVar3 == 0 && *pvVar8 == 0) {
              i_2 = i_2 + 1;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_128,(long)y2);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(local_90 + 0x10),pvVar7);
              iVar1 = x2;
              j_1 = 1;
              piVar10 = std::max<int>(&i_2,&j_1);
              iVar3 = *piVar10;
              iVar4 = idx(this,(double)temp);
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](__return_storage_ptr__,(long)iVar4);
              iVar4 = idx(this,(double)local_214);
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)iVar4);
              *pvVar8 = iVar1 + iVar3;
              pvVar7 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_50,(long)temp);
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_214);
              *pvVar8 = 1;
            }
          }
        }
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_128);
      next_state.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e8);
  } while (next_state.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0);
  for (local_220 = 0;
      sVar5 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(__return_storage_ptr__), (ulong)(long)local_220 < sVar5;
      local_220 = local_220 + 1) {
    local_224 = 0;
    while( true ) {
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](__return_storage_ptr__,0);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
      if (sVar5 <= (ulong)(long)local_224) break;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](__return_storage_ptr__,(long)local_220);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_224);
      if (*pvVar8 == 0) {
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](__return_storage_ptr__,(long)local_220);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_224);
        *pvVar8 = 999;
      }
      local_224 = local_224 + 1;
    }
  }
  closed.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  next_state.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_90 + 0x10));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_50);
  if ((closed.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<int> > HBF::heuristic_basic(vector<vector<int> > grid, vector<double> start, vector<int> goal){
    /*
    Create the heuristic function for A star searches on a grid, given start position and goal position.
    */

    vector<vector<int> > heuristic = grid;
    vector<vector<int> > closed = grid;

    // give obstacles a very large value
    for (int i = 0; i < heuristic.size(); i ++){
        for (int j = 0; j < heuristic[0].size(); j ++){
            if (heuristic[i][j] == 1){
                heuristic[i][j] = 999;
            }
        }
    }

    vector<vector<int>> opened = {{int(start[0]),int(start[1])}};

    heuristic[int(start[0])][int(start[1])] = 1;

    while (!opened.empty() ) {

        vector<int> next = opened[0]; //grab first element
        opened.erase(opened.begin()); //pop first element

        int x = next[0];
        int y = next[1];

        if (x == goal[0] && y == goal[1]) {
            break;
        }

        vector<vector<int>> next_state;
        next_state.push_back({x-1,y});
        next_state.push_back({x,y+1});
        next_state.push_back({x+1,y});
        next_state.push_back({x,y-1});

        int g = heuristic[x][y];

        for (int i = 0; i < next_state.size(); i++) {

            int x2 = next_state[i][0];
            int y2 = next_state[i][1];
            int temp = 0;

            if ((x2 < 0 || x2 >= grid.size()) || (y2 < 0 || y2 >= grid[0].size())) {
                //invalid cell
                continue;
            }

            if (heuristic[idx(x2)][idx(y2)] == 0 & closed[x2][y2] == 0) {
                temp += 1;
                opened.push_back(next_state[i]);
                heuristic[idx(x2)][idx(y2)] = g + max(temp, 1);
                closed[x2][y2] = 1;
            }

        }

    }

    // any remaining unreached cell takes on 999
    for (int i = 0; i < heuristic.size(); i ++){
        for (int j = 0; j < heuristic[0].size(); j ++){
            if (heuristic[i][j] == 0){
                heuristic[i][j] = 999;
            }
        }
    }

    return heuristic;

}